

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::BeginViewportSideBar
               (char *name,ImGuiViewport *viewport_p,ImGuiDir dir,float axis_size,
               ImGuiWindowFlags window_flags)

{
  float fVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  ImGuiWindow_conflict *pIVar4;
  float *pfVar5;
  size_t idx;
  ImVec2 pos;
  ImRect avail_rect;
  ImVec2 local_40;
  ImVec2 size;
  
  if (dir != -1) {
    pIVar4 = FindWindowByName(name);
    if (viewport_p == (ImGuiViewport *)0x0) {
      viewport_p = GetMainViewport();
    }
    if ((pIVar4 == (ImGuiWindow_conflict *)0x0) || (pIVar4->BeginCount == 0)) {
      avail_rect = ImGuiViewportP::GetBuildWorkRect((ImGuiViewportP *)viewport_p);
      pos = avail_rect.Min;
      if ((dir | 2U) == 3) {
        idx = (size_t)((dir & 0xfffffffeU) == 2);
        pfVar5 = ImVec2::operator[](&avail_rect.Max,idx);
        fVar1 = *pfVar5;
        pfVar5 = ImVec2::operator[](&pos,idx);
        *pfVar5 = fVar1 - axis_size;
      }
      else {
        idx = (size_t)((dir & 0xfffffffeU) == 2);
      }
      size.x = avail_rect.Max.x - avail_rect.Min.x;
      size.y = avail_rect.Max.y - avail_rect.Min.y;
      pfVar5 = ImVec2::operator[](&size,idx);
      *pfVar5 = axis_size;
      local_40.x = 0.0;
      local_40.y = 0.0;
      SetNextWindowPos(&pos,0,&local_40);
      SetNextWindowSize(&size,0);
      if ((dir & 0xfffffffdU) == 0) {
        pfVar5 = ImVec2::operator[](&((ImGuiViewportP *)viewport_p)->BuildWorkOffsetMin,idx);
        *pfVar5 = axis_size + *pfVar5;
      }
      else if ((dir | 2U) == 3) {
        pfVar5 = ImVec2::operator[](&((ImGuiViewportP *)viewport_p)->BuildWorkOffsetMax,idx);
        *pfVar5 = *pfVar5 - axis_size;
      }
    }
    SetNextWindowViewport((((ImGuiViewportP *)viewport_p)->super_ImGuiViewport).ID);
    PushStyleVar(3,0.0);
    auVar2._8_8_ = 0;
    auVar2._0_4_ = avail_rect.Max.x;
    auVar2._4_4_ = avail_rect.Max.y;
    avail_rect = (ImRect)(auVar2 << 0x40);
    PushStyleVar(5,&avail_rect.Min);
    bVar3 = Begin(name,(bool *)0x0,window_flags | 0x200007);
    PopStyleVar(2);
    return bVar3;
  }
  __assert_fail("dir != ImGuiDir_None",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                ,0x1a63,
                "bool ImGui::BeginViewportSideBar(const char *, ImGuiViewport *, ImGuiDir, float, ImGuiWindowFlags)"
               );
}

Assistant:

bool ImGui::BeginViewportSideBar(const char* name, ImGuiViewport* viewport_p, ImGuiDir dir, float axis_size, ImGuiWindowFlags window_flags)
{
    IM_ASSERT(dir != ImGuiDir_None);

    ImGuiWindow* bar_window = FindWindowByName(name);
    ImGuiViewportP* viewport = (ImGuiViewportP*)(void*)(viewport_p ? viewport_p : GetMainViewport());
    if (bar_window == NULL || bar_window->BeginCount == 0)
    {
        // Calculate and set window size/position
        ImRect avail_rect = viewport->GetBuildWorkRect();
        ImGuiAxis axis = (dir == ImGuiDir_Up || dir == ImGuiDir_Down) ? ImGuiAxis_Y : ImGuiAxis_X;
        ImVec2 pos = avail_rect.Min;
        if (dir == ImGuiDir_Right || dir == ImGuiDir_Down)
            pos[axis] = avail_rect.Max[axis] - axis_size;
        ImVec2 size = avail_rect.GetSize();
        size[axis] = axis_size;
        SetNextWindowPos(pos);
        SetNextWindowSize(size);

        // Report our size into work area (for next frame) using actual window size
        if (dir == ImGuiDir_Up || dir == ImGuiDir_Left)
            viewport->BuildWorkOffsetMin[axis] += axis_size;
        else if (dir == ImGuiDir_Down || dir == ImGuiDir_Right)
            viewport->BuildWorkOffsetMax[axis] -= axis_size;
    }

    window_flags |= ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoDocking;
    SetNextWindowViewport(viewport->ID); // Enforce viewport so we don't create our own viewport when ImGuiConfigFlags_ViewportsNoMerge is set.
    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowMinSize, ImVec2(0, 0)); // Lift normal size constraint
    bool is_open = Begin(name, NULL, window_flags);
    PopStyleVar(2);

    return is_open;
}